

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

void __thiscall Js::TypedArrayBase::Set(TypedArrayBase *this,TypedArrayBase *source,uint32 offset)

{
  Type puVar1;
  bool bVar2;
  uint32 uVar3;
  TypeId TVar4;
  TypeId TVar5;
  uint32 uVar6;
  uint uVar7;
  int iVar8;
  ScriptContext *pSVar9;
  ulong uVar10;
  byte *src;
  ArrayBufferBase *pAVar11;
  ArrayBufferBase *pAVar12;
  undefined4 extraout_var;
  JavascriptLibrary *this_00;
  JavascriptArray *pJVar13;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint local_48;
  uint local_44;
  uint32 i_2;
  uint32 i_1;
  JavascriptArray *tmpArray;
  uint32 i;
  size_t offsetInBytes;
  uint32 local_20;
  uint32 totalLength;
  uint32 sourceLength;
  uint32 offset_local;
  TypedArrayBase *source_local;
  TypedArrayBase *this_local;
  
  totalLength = offset;
  _sourceLength = source;
  source_local = this;
  local_20 = ArrayObject::GetLength((ArrayObject *)source);
  bVar2 = UInt32Math::Add(totalLength,local_20,(uint32 *)((long)&offsetInBytes + 4));
  if ((bVar2) || (uVar3 = ArrayObject::GetLength((ArrayObject *)this), uVar3 < offsetInBytes._4_4_))
  {
    pSVar9 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    JavascriptError::ThrowRangeError(pSVar9,-0x7ff5ec24,(PCWSTR)0x0);
  }
  bVar2 = IsDetachedBuffer(_sourceLength);
  if (bVar2) {
    pSVar9 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    JavascriptError::ThrowTypeError(pSVar9,-0x7ff5ebe5,(PCWSTR)0x0);
  }
  TVar4 = RecyclableObject::GetTypeId((RecyclableObject *)this);
  TVar5 = RecyclableObject::GetTypeId((RecyclableObject *)_sourceLength);
  if (TVar4 != TVar5) {
    uVar3 = GetBytesPerElement(this);
    uVar6 = GetBytesPerElement(_sourceLength);
    if (((uVar3 != uVar6) ||
        (((bVar2 = VarIs<Js::TypedArray<unsigned_char,true,false>,Js::TypedArrayBase>(this), bVar2
          || (bVar2 = VarIs<Js::TypedArray<unsigned_char,true,true>,Js::TypedArrayBase>(this), bVar2
             )) && ((bVar2 = VarIs<Js::TypedArray<char,false,false>,Js::TypedArrayBase>
                                       (_sourceLength), bVar2 ||
                    (bVar2 = VarIs<Js::TypedArray<char,false,true>,Js::TypedArrayBase>
                                       (_sourceLength), bVar2)))))) ||
       ((((((bVar2 = VarIs<Js::TypedArray<float,false,false>,Js::TypedArrayBase>(this), bVar2 ||
            (bVar2 = VarIs<Js::TypedArray<float,false,false>,Js::TypedArrayBase>(_sourceLength),
            bVar2)) ||
           (bVar2 = VarIs<Js::TypedArray<float,false,true>,Js::TypedArrayBase>(this), bVar2)) ||
          ((bVar2 = VarIs<Js::TypedArray<float,false,true>,Js::TypedArrayBase>(_sourceLength), bVar2
           || (bVar2 = VarIs<Js::TypedArray<double,false,false>,Js::TypedArrayBase>(this), bVar2))))
         || (bVar2 = VarIs<Js::TypedArray<double,false,false>,Js::TypedArrayBase>(_sourceLength),
            bVar2)) ||
        ((bVar2 = VarIs<Js::TypedArray<double,false,true>,Js::TypedArrayBase>(this), bVar2 ||
         (bVar2 = VarIs<Js::TypedArray<double,false,true>,Js::TypedArrayBase>(_sourceLength), bVar2)
         ))))) {
      pAVar11 = ArrayBufferParent::GetArrayBuffer(&_sourceLength->super_ArrayBufferParent);
      pAVar12 = ArrayBufferParent::GetArrayBuffer(&this->super_ArrayBufferParent);
      if (pAVar11 == pAVar12) {
        pSVar9 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
        this_00 = ScriptContext::GetLibrary(pSVar9);
        pJVar13 = JavascriptLibrary::CreateArray(this_00,local_20);
        for (local_44 = 0; local_44 < local_20; local_44 = local_44 + 1) {
          iVar8 = (*(_sourceLength->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                    super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x72])(_sourceLength,(ulong)local_44);
          (*(pJVar13->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                    (pJVar13,(ulong)local_44,CONCAT44(extraout_var_00,iVar8),0);
        }
        for (local_48 = 0; local_48 < local_20; local_48 = local_48 + 1) {
          uVar7 = totalLength + local_48;
          iVar8 = (*(pJVar13->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                    super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x72])(pJVar13,(ulong)local_48);
          (*(this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x70])(this,(ulong)uVar7,CONCAT44(extraout_var_01,iVar8));
        }
      }
      else {
        for (tmpArray._4_4_ = 0; tmpArray._4_4_ < local_20; tmpArray._4_4_ = tmpArray._4_4_ + 1) {
          uVar7 = totalLength + tmpArray._4_4_;
          iVar8 = (*(_sourceLength->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                    super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x74])(_sourceLength,(ulong)tmpArray._4_4_);
          (*(this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x73])(this,(ulong)uVar7,CONCAT44(extraout_var,iVar8));
        }
      }
      bVar2 = IsDetachedBuffer(_sourceLength);
      if ((!bVar2) && (bVar2 = IsDetachedBuffer(this), !bVar2)) {
        return;
      }
      Throw::FatalInternalError(-0x7fffbffb);
    }
  }
  uVar10 = (ulong)(totalLength * this->BYTES_PER_ELEMENT);
  puVar1 = this->buffer;
  uVar3 = GetByteLength(this);
  src = GetByteBuffer(_sourceLength);
  uVar6 = GetByteLength(_sourceLength);
  memmove_s(puVar1 + uVar10,uVar3 - uVar10,src,(ulong)uVar6);
  return;
}

Assistant:

void TypedArrayBase::Set(TypedArrayBase* source, uint32 offset)
    {
        uint32 sourceLength = source->GetLength();
        uint32 totalLength;

        if (UInt32Math::Add(offset, sourceLength, &totalLength) ||
            (totalLength > GetLength()))
        {
            JavascriptError::ThrowRangeError(
                GetScriptContext(), JSERR_InvalidTypedArrayLength);
        }

        if (source->IsDetachedBuffer())
        {
            JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_DetachedTypedArray);
        }

        // memmove buffer if views have same bit representation.
        // types of the same size are compatible, with the following exceptions:
        // - we cannot memmove between float and int arrays, due to different bit pattern
        // - we cannot memmove to a uint8 clamped array from an int8 array, due to negatives rounding to 0
        if (GetTypeId() == source->GetTypeId() ||
            (GetBytesPerElement() == source->GetBytesPerElement()
             && !((VarIs<Uint8ClampedArray>(this) || VarIs<Uint8ClampedVirtualArray>(this)) && (VarIs<Int8Array>(source) || VarIs<Int8VirtualArray>(source)))
             && !VarIs<Float32Array>(this) && !VarIs<Float32Array>(source)
             && !VarIs<Float32VirtualArray>(this) && !VarIs<Float32VirtualArray>(source)
             && !VarIs<Float64Array>(this) && !VarIs<Float64Array>(source)
             && !VarIs<Float64VirtualArray>(this) && !VarIs<Float64VirtualArray>(source)))
        {
            const size_t offsetInBytes = offset * BYTES_PER_ELEMENT;
            memmove_s(buffer + offsetInBytes,
                      GetByteLength() - offsetInBytes,
                      source->GetByteBuffer(),
                      source->GetByteLength());
        }
        else
        {
            if (source->GetArrayBuffer() != GetArrayBuffer())
            {
                for (uint32 i = 0; i < sourceLength; i++)
                {
                    DirectSetItemNoDetachCheck(offset + i, source->DirectGetItemNoDetachCheck(i));
                }
            }
            else
            {
                // We can have the source and destination coming from the same buffer. element size, start offset, and
                // length for source and dest typed array can be different. Use a separate tmp buffer to copy the elements.
                Js::JavascriptArray* tmpArray = GetScriptContext()->GetLibrary()->CreateArray(sourceLength);
                for (uint32 i = 0; i < sourceLength; i++)
                {
                    tmpArray->SetItem(i, source->DirectGetItem(i), PropertyOperation_None);
                }
                for (uint32 i = 0; i < sourceLength; i++)
                {
                    DirectSetItem(offset + i, tmpArray->DirectGetItem(i));
                }
            }
            if (source->IsDetachedBuffer() || this->IsDetachedBuffer())
            {
                Throw::FatalInternalError();
            }
        }
    }